

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage_conversions.cpp
# Opt level: O2

void convert_ARGB32_to_RGBA64<false>(QImageData *dest,QImageData *src,ImageConversionFlags param_3)

{
  FetchAndConvertPixelsFunc64 p_Var1;
  int i;
  int iVar2;
  QRgba64 *pQVar3;
  uchar *puVar4;
  
  puVar4 = src->data;
  pQVar3 = (QRgba64 *)dest->data;
  p_Var1 = qPixelLayouts[src->format + Format_Mono].fetchToRGBA64PM;
  for (iVar2 = 0; iVar2 < src->height; iVar2 = iVar2 + 1) {
    (*p_Var1)(pQVar3,puVar4,0,src->width,(QList<unsigned_int> *)0x0,(QDitherInfo *)0x0);
    puVar4 = puVar4 + src->bytes_per_line;
    pQVar3 = (QRgba64 *)((long)&pQVar3->rgba + dest->bytes_per_line);
  }
  return;
}

Assistant:

static void convert_ARGB32_to_RGBA64(QImageData *dest, const QImageData *src, Qt::ImageConversionFlags)
{
    Q_ASSERT(RGBA || src->format == QImage::Format_ARGB32);
    Q_ASSERT(!RGBA || src->format == QImage::Format_RGBA8888);
    Q_ASSERT(dest->format == QImage::Format_RGBA64);
    Q_ASSERT(src->width == dest->width);
    Q_ASSERT(src->height == dest->height);

    const uchar *src_data = src->data;
    uchar *dest_data = dest->data;
    const FetchAndConvertPixelsFunc64 fetch = qPixelLayouts[qt_toPremultipliedFormat(src->format)].fetchToRGBA64PM;

    for (int i = 0; i < src->height; ++i) {
        fetch(reinterpret_cast<QRgba64 *>(dest_data), src_data, 0, src->width, nullptr, nullptr);
        src_data += src->bytes_per_line;
        dest_data += dest->bytes_per_line;
    }
}